

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testLoadUnstructured.hpp
# Opt level: O0

pair<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_> *
generateExactData<makeTests(TasGrid::TypeAcceleration,int)::__16>
          (pair<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
           *__return_storage_ptr__,TasmanianSparseGrid *grid)

{
  int b;
  int b_00;
  int iVar1;
  int a;
  int b_01;
  size_t sVar2;
  reference x_00;
  reference y_00;
  int local_74;
  allocator<double> local_6d;
  int i;
  undefined1 local_60 [8];
  vector<double,_std::allocator<double>_> y;
  vector<double,_std::allocator<double>_> x;
  int num_samples;
  int num_outputs;
  int num_dimensions;
  TasmanianSparseGrid *grid_local;
  pair<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
  *local_10;
  
  local_10 = __return_storage_ptr__;
  b = TasGrid::TasmanianSparseGrid::getNumDimensions(grid);
  b_00 = TasGrid::TasmanianSparseGrid::getNumOutputs(grid);
  iVar1 = TasGrid::TasmanianSparseGrid::getNumPoints(grid);
  TasGrid::TasmanianSparseGrid::getPoints
            ((vector<double,_std::allocator<double>_> *)
             &y.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,grid);
  a = TasGrid::TasmanianSparseGrid::getNumOutputs(grid);
  b_01 = TasGrid::TasmanianSparseGrid::getNumPoints(grid);
  sVar2 = TasGrid::Utils::size_mult<int,int>(a,b_01);
  std::allocator<double>::allocator(&local_6d);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_60,sVar2,&local_6d);
  std::allocator<double>::~allocator(&local_6d);
  for (local_74 = 0; local_74 < iVar1; local_74 = local_74 + 1) {
    sVar2 = TasGrid::Utils::size_mult<int,int>(local_74,b);
    x_00 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)
                      &y.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,sVar2);
    sVar2 = TasGrid::Utils::size_mult<int,int>(local_74,b_00);
    y_00 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_60,sVar2);
    makeTests::anon_class_1_0_00000001::operator()
              ((anon_class_1_0_00000001 *)((long)&grid_local + 7),x_00,y_00,0);
  }
  std::
  make_pair<std::vector<double,std::allocator<double>>,std::vector<double,std::allocator<double>>>
            (__return_storage_ptr__,
             (vector<double,_std::allocator<double>_> *)
             &y.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage,(vector<double,_std::allocator<double>_> *)local_60);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_60);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)
             &y.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_end_of_storage);
  return __return_storage_ptr__;
}

Assistant:

std::pair<std::vector<double>, std::vector<double>> generateExactData(TasmanianSparseGrid const &grid, CallableModel model){
    int num_dimensions = grid.getNumDimensions();
    int num_outputs = grid.getNumOutputs();
    int num_samples = grid.getNumPoints();
    auto x = grid.getPoints();
    std::vector<double> y(Utils::size_mult(grid.getNumOutputs(), grid.getNumPoints()));

    for(int i=0; i<num_samples; i++)
        model(&x[Utils::size_mult(i, num_dimensions)], &y[Utils::size_mult(i, num_outputs)], 0);

    return std::make_pair(std::move(x), std::move(y));
}